

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

bool __thiscall
google::
dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
::maybe_shrink(dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
               *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong min_buckets_wanted;
  dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  tmp;
  dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  local_60;
  
  uVar3 = (this->settings).super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>.
          shrink_threshold_;
  uVar2 = this->num_elements - this->num_deleted;
  if ((uVar2 < uVar3 && uVar3 != 0) && (0x20 < this->num_buckets)) {
    uVar3 = this->num_buckets;
    do {
      min_buckets_wanted = uVar3 >> 1;
      if (uVar3 < 0x42) break;
      uVar3 = min_buckets_wanted;
    } while ((float)uVar2 <
             (float)min_buckets_wanted *
             (this->settings).
             super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>.shrink_factor_)
    ;
    dense_hashtable(&local_60,this,min_buckets_wanted);
    swap(this,&local_60);
    if (local_60.table != (pointer)0x0) {
      free(local_60.table);
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  (this->settings).super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  return bVar1;
}

Assistant:

bool maybe_shrink() {
    assert(num_elements >= num_deleted);
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // is a power of two
    assert(bucket_count() >= HT_MIN_BUCKETS);
    bool retval = false;

    // If you construct a hashtable with < HT_DEFAULT_STARTING_BUCKETS,
    // we'll never shrink until you get relatively big, and we'll never
    // shrink below HT_DEFAULT_STARTING_BUCKETS.  Otherwise, something
    // like "dense_hash_set<int> x; x.insert(4); x.erase(4);" will
    // shrink us down to HT_MIN_BUCKETS buckets, which is too small.
    const size_type num_remain = num_elements - num_deleted;
    const size_type shrink_threshold = settings.shrink_threshold();
    if (shrink_threshold > 0 && num_remain < shrink_threshold &&
        bucket_count() > HT_DEFAULT_STARTING_BUCKETS) {
      const float shrink_factor = settings.shrink_factor();
      size_type sz = bucket_count() / 2;  // find how much we should shrink
      while (sz > HT_DEFAULT_STARTING_BUCKETS &&
             num_remain < sz * shrink_factor) {
        sz /= 2;  // stay a power of 2
      }
      dense_hashtable tmp(std::move(*this), sz);  // Do the actual resizing
      swap(tmp);                       // now we are tmp
      retval = true;
    }
    settings.set_consider_shrink(false);  // because we just considered it
    return retval;
  }